

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<tinyusdz::value::point3f>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::point3f>_> *attr,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Path *v;
  byte bVar2;
  pprint *ppVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  undefined8 uVar8;
  pointer pPVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar10;
  byte bVar11;
  char *pcVar12;
  byte bVar13;
  point3f a;
  stringstream ss;
  string local_250;
  pprint *local_230;
  uint32_t local_224;
  byte local_220;
  undefined6 local_218;
  undefined2 uStack_212;
  uint32_t local_210;
  byte local_20c;
  char local_20b;
  TypedTimeSamples<tinyusdz::value::point3f> local_208;
  string *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_230 = (pprint *)CONCAT44(in_register_0000000c,indent);
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar6 = (attr->_attrib).has_value_;
  local_1e0 = __return_storage_ptr__;
  if (bVar6 == false) {
    pPVar9 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar9 == (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      if ((attr->_value_empty == false) && ((attr->_blocked & 1U) == 0)) goto LAB_002f04b8;
      bVar11 = (attr->_blocked ^ 1U) & attr->_value_empty;
      bVar2 = 0;
      local_220 = bVar6;
    }
    else {
      bVar2 = 1;
      bVar11 = 0;
      local_220 = bVar6;
    }
  }
  else {
    uVar8 = *(undefined8 *)((long)&(attr->_attrib).contained + 6);
    local_218 = (undefined6)*(undefined8 *)&(attr->_attrib).contained;
    uStack_212 = (undefined2)uVar8;
    local_210 = (uint32_t)((ulong)uVar8 >> 0x10);
    local_20c = (byte)((ulong)uVar8 >> 0x30);
    local_20b = (char)((ulong)uVar8 >> 0x38);
    local_220 = bVar6;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
    ::vector(&local_208._samples,
             (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
              *)((long)&(attr->_attrib).contained + 0x10));
    local_208._dirty = *(bool *)((long)&(attr->_attrib).contained + 0x28);
    pPVar9 = (pointer)CONCAT71((int7)((ulong)uVar8 >> 8),local_208._dirty);
    bVar2 = 0;
    bVar11 = 0;
  }
  bVar13 = local_20c;
  indent_00 = (uint32_t)pPVar9;
  if ((local_220 & 1) == 0) {
    bVar13 = 0;
    local_224 = 0;
  }
  else {
    if (((ulong)pPVar9 & 1) != 0) {
      TypedTimeSamples<tinyusdz::value::point3f>::update(&local_208);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_208._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_208._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_208._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_224 = indent_00;
  }
  if ((((local_220 & 1) == 0) || (local_20b != '\0')) || (local_20c != 0)) {
    bVar6 = false;
  }
  else {
    bVar6 = local_208._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_208._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar5 = AttrMetas::authored(&attr->_metas);
  if (((bVar5) || (!(bool)(bVar2 | bVar6))) ||
     (n_01 = n, ((bVar11 | attr->_blocked | bVar13) & 1) != 0)) {
    pprint::Indent_abi_cxx11_(&local_250,local_230,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_250.field_2._M_allocated_capacity._0_4_ = 0x6e696f70;
    local_250._M_string_length = 7;
    local_250.field_2._M_allocated_capacity._4_4_ = 0x663374;
    local_250._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (attr->_blocked == true) {
      pcVar12 = " = None";
      lVar10 = 7;
LAB_002f0135:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar12,lVar10);
    }
    else if (bVar13 != 0) {
      if (local_220 == 0) goto LAB_002f0511;
      if ((local_20b != '\0') || (local_20c != 1)) {
        pcVar12 = " = [InternalError]";
        lVar10 = 0x12;
        goto LAB_002f0135;
      }
      local_250._M_string_length = CONCAT44(local_250._M_string_length._4_4_,local_210);
      local_250._M_dataplus._M_p = (pointer)CONCAT26(uStack_212,local_218);
      indent_00 = local_210;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      ::std::operator<<(local_1a8,(point3f *)&local_250);
    }
    bVar6 = AttrMetas::authored(&attr->_metas);
    if (bVar6) {
      local_1e8 = name;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      ppVar3 = local_230;
      print_attr_metas_abi_cxx11_
                (&local_250,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)local_230 + 1),indent_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)ppVar3 & 0xffffffff),n_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      name = local_1e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                                 local_250.field_2._M_allocated_capacity._0_4_) + 1);
        name = local_1e8;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_224 != '\0') {
    pprint::Indent_abi_cxx11_(&local_250,local_230,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_250.field_2._M_allocated_capacity._0_4_ = 0x6e696f70;
    local_250._M_string_length = 7;
    local_250.field_2._M_allocated_capacity._4_4_ = 0x663374;
    local_250._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_220 == 0) {
LAB_002f0511:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::point3f>>::value() const [T = tinyusdz::Animatable<tinyusdz::value::point3f>]"
                   );
    }
    print_typed_timesamples<tinyusdz::value::point3f>(&local_250,&local_208,(uint32_t)local_230);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_250,local_230,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_250.field_2._M_allocated_capacity._0_4_ = 0x6e696f70;
    local_250._M_string_length = 7;
    local_250.field_2._M_allocated_capacity._4_4_ = 0x663374;
    local_250._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar10 = ((long)(attr->_paths).
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar10 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar10 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if ((local_220 == 1) &&
     (local_208._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_208._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002f04b8:
  psVar4 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}